

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O1

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,UnqualifiedName *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string sStack_68;
  CompileMessage local_48;
  
  AST::UnqualifiedName::toString_abi_cxx11_(&sStack_68,name);
  CompileMessageHelpers::createMessage<std::__cxx11::string>
            (&local_48,(CompileMessageHelpers *)0x1,none,0x2ac591,(char *)&sStack_68,in_R9);
  AST::Context::throwError
            (&(name->super_Expression).super_Statement.super_ASTObject.context,&local_48,false);
}

Assistant:

void visit (AST::UnqualifiedName& name) override
        {
            super::visit (name);
            name.context.throwError (Errors::unresolvedSymbol (name.toString()));
        }